

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonsugar.hpp
# Opt level: O1

type * __thiscall
nonsugar::
parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>>
          (type *__return_storage_ptr__,nonsugar *this,
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          begin,__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                end,
          basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__v_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__V_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__a_,_int>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_int>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__c_,_boost::optional<int>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__d_,_boost::optional<int>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__e_,_boost::optional<int>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__f_,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__g_,_int>_>,_std::tuple<>,_std::tuple<>_>
          *command,argument_order order)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__n;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  bool *flg;
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__d_,_boost::optional<int>_>
  *flg_00;
  vector<std::__detail::_State<char>,_std::allocator<std::__detail::_State<char>_>_> *flg_01;
  undefined8 uVar3;
  element_type *peVar4;
  int iVar5;
  pointer psVar6;
  ostream *poVar7;
  basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pbVar8;
  pointer pbVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *long_name;
  undefined8 uVar10;
  bool bVar11;
  bool exact;
  bool exclusive;
  const_iterator arg_it;
  string_type name;
  const_iterator arg_last;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  match;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  partial_matches;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  argument_args;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  sstream<string_type> ss;
  undefined1 local_2da [10];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  element_type *local_2b0;
  value_type *local_2a8;
  type *local_2a0;
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__g_,_int>
  *local_298;
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__c_,_boost::optional<int>_>
  *local_290;
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_int>
  *local_288;
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__a_,_int>
  *local_280;
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__V_,_void>
  *local_278;
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__v_,_void>
  *local_270;
  undefined1 local_268 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  undefined8 local_238;
  int local_22c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  value_type **local_198;
  type *local_190;
  element_type *local_188;
  undefined1 *local_180;
  
  local_22c = (int)command;
  memset(__return_storage_ptr__,0,0x90);
  (__return_storage_ptr__->super_option_pair<char,__v_,_void>).value.
  super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)end._M_current[0x2f].field_2._M_allocated_capacity;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(__return_storage_ptr__->super_option_pair<char,__v_,_void>).value.
              super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&end._M_current[0x2f].field_2 + 8)
            );
  (__return_storage_ptr__->super_option_pair<char,__V_,_void>).value.
  super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)end._M_current[0x2a]._M_string_length;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(__return_storage_ptr__->super_option_pair<char,__V_,_void>).value.
              super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &end._M_current[0x2a].field_2._M_allocated_capacity);
  (__return_storage_ptr__->super_option_pair<char,__a_,_int>).value.
  super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)end._M_current[0x25]._M_dataplus._M_p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(__return_storage_ptr__->super_option_pair<char,__a_,_int>).value.
              super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&end._M_current[0x25]._M_string_length);
  (__return_storage_ptr__->super_option_pair<char,__b_,_int>).value.
  super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)((long)&end._M_current[0x1f].field_2 + 8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(__return_storage_ptr__->super_option_pair<char,__b_,_int>).value.
              super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(end._M_current + 0x20));
  (__return_storage_ptr__->super_option_pair<char,__c_,_boost::optional<int>_>).value.
  super___shared_ptr<boost::optional<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)end._M_current[0x1a].field_2._M_allocated_capacity;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(__return_storage_ptr__->super_option_pair<char,__c_,_boost::optional<int>_>).value.
              super___shared_ptr<boost::optional<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&end._M_current[0x1a].field_2 + 8)
            );
  (__return_storage_ptr__->super_option_pair<char,__d_,_boost::optional<int>_>).value.
  super___shared_ptr<boost::optional<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)end._M_current[0x15]._M_string_length;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(__return_storage_ptr__->super_option_pair<char,__d_,_boost::optional<int>_>).value.
              super___shared_ptr<boost::optional<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &end._M_current[0x15].field_2._M_allocated_capacity);
  (__return_storage_ptr__->super_option_pair<char,__e_,_boost::optional<int>_>).value.
  super___shared_ptr<boost::optional<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)end._M_current[0x10]._M_dataplus._M_p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(__return_storage_ptr__->super_option_pair<char,__e_,_boost::optional<int>_>).value.
              super___shared_ptr<boost::optional<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&end._M_current[0x10]._M_string_length);
  (__return_storage_ptr__->
  super_option_pair<char,__f_,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).value.
  super___shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = *(element_type **)((long)&end._M_current[10].field_2 + 8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(__return_storage_ptr__->
              super_option_pair<char,__f_,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ).value.
              super___shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(end._M_current + 0xb));
  (__return_storage_ptr__->super_option_pair<char,__g_,_int>).value.
  super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)end._M_current[5].field_2._M_allocated_capacity;
  local_2b0 = (element_type *)end._M_current;
  local_2a0 = __return_storage_ptr__;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(__return_storage_ptr__->super_option_pair<char,__g_,_int>).value.
              super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&end._M_current[5].field_2 + 8));
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1d0,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )this,begin,(allocator_type *)local_1b8);
  local_2da._2_8_ =
       local_1d0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_2a8 = local_1d0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_2da[1] = '\0';
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_1d0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1d0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_298 = (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__g_,_int>
                 *)((long)&(local_2b0->
                           super_vector<std::__detail::_State<char>,_std::allocator<std::__detail::_State<char>_>_>
                           ).
                           super__Vector_base<std::__detail::_State<char>,_std::allocator<std::__detail::_State<char>_>_>
                           ._M_impl.super__Vector_impl_data + 8);
    local_270 = (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__v_,_void>
                 *)(local_2b0 + 0x10);
    local_278 = (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__V_,_void>
                 *)((long)&(local_2b0 + 0xd)[1].super__NFA_base._M_paren_stack.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + 8);
    local_280 = (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__a_,_int>
                 *)((long)&local_2b0[0xc].super__NFA_base._M_paren_stack.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                   + 0x10);
    local_288 = (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_int>
                 *)((long)&local_2b0[10].super__NFA_base + 0x18);
    local_290 = (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__c_,_boost::optional<int>_>
                 *)&local_2b0[8].super__NFA_base._M_start_state;
    flg_00 = (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__d_,_boost::optional<int>_>
              *)((long)&local_2b0[6].super__NFA_base + 0x28);
    flg = &local_2b0[4].super__NFA_base._M_has_backref;
    flg_01 = &local_2b0[2].
              super_vector<std::__detail::_State<char>,_std::allocator<std::__detail::_State<char>_>_>
    ;
    pbVar9 = local_1d0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    while( true ) {
      local_1b8._0_8_ = local_1b8 + 0x10;
      local_2da._2_8_ = pbVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"--","");
      __n = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            pbVar9->_M_string_length;
      if (__n == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1b8._8_8_) {
        if (__n == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar11 = true;
        }
        else {
          iVar5 = bcmp((pbVar9->_M_dataplus)._M_p,(void *)local_1b8._0_8_,(size_t)__n);
          bVar11 = iVar5 == 0;
        }
      }
      else {
        bVar11 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_1b8 + 0x10)) {
        operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._M_allocated_capacity + 1));
      }
      uVar3 = local_2da._2_8_;
      if (bVar11) break;
      local_268._16_8_ = (pointer)0x0;
      local_268._24_8_ = (char *)0x0;
      local_268._0_8_ = (pointer)0x0;
      local_268._8_8_ = (pointer)0x0;
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"--([^=]+)(?:=(.*))?","")
      ;
      std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
      basic_regex<std::char_traits<char>,std::allocator<char>>
                ((basic_regex<char,std::__cxx11::regex_traits<char>> *)local_1b8,&local_2d0,0x10);
      _Var2._M_current = *(char **)uVar3;
      bVar11 = std::__detail::
               __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                         (_Var2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )(_Var2._M_current + *(size_type *)(uVar3 + 8)),
                          (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)local_268,
                          (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_1b8,0);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
        operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
      }
      uVar3 = local_2da._2_8_;
      if (bVar11) {
        std::__cxx11::
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::str(&local_2d0,
              (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)local_268,1);
        peVar4 = local_2b0;
        local_2da[0] = '\0';
        local_248._M_allocated_capacity = 0;
        local_248._8_8_ = (undefined8 *)0x0;
        local_238._0_1_ = false;
        local_238._1_7_ = 0;
        local_1b8._8_8_ = local_2da;
        local_1a8._M_allocated_capacity = (size_type)local_2b0;
        local_1a8._8_8_ = &local_248;
        local_1b8._0_8_ = &local_2d0;
        parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>const&,nonsugar::argument_order)
        ::{lambda(auto:1_const&)#2}::operator()((_lambda_auto_1_const___2_ *)local_1b8,local_270);
        parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>const&,nonsugar::argument_order)
        ::{lambda(auto:1_const&)#2}::operator()((_lambda_auto_1_const___2_ *)local_1b8,local_278);
        parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>const&,nonsugar::argument_order)
        ::{lambda(auto:1_const&)#2}::operator()((_lambda_auto_1_const___2_ *)local_1b8,local_280);
        parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>const&,nonsugar::argument_order)
        ::{lambda(auto:1_const&)#2}::operator()((_lambda_auto_1_const___2_ *)local_1b8,local_288);
        parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>const&,nonsugar::argument_order)
        ::{lambda(auto:1_const&)#2}::operator()((_lambda_auto_1_const___2_ *)local_1b8,local_290);
        parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>const&,nonsugar::argument_order)
        ::{lambda(auto:1_const&)#2}::operator()((_lambda_auto_1_const___2_ *)local_1b8,flg_00);
        parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>const&,nonsugar::argument_order)
        ::{lambda(auto:1_const&)#2}::operator()
                  ((_lambda_auto_1_const___2_ *)local_1b8,
                   (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__e_,_boost::optional<int>_>
                    *)flg);
        parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>const&,nonsugar::argument_order)
        ::{lambda(auto:1_const&)#2}::operator()
                  ((_lambda_auto_1_const___2_ *)local_1b8,
                   (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__f_,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)flg_01);
        parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>const&,nonsugar::argument_order)
        ::{lambda(auto:1_const&)#2}::operator()((_lambda_auto_1_const___2_ *)local_1b8,local_298);
        if (local_2da[0] == '\0') {
          if (local_248._M_allocated_capacity == local_248._8_8_) {
            pbVar8 = (basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)__cxa_allocate_exception(0x28);
            local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1f0,": unrecognized option: --","");
            std::operator+(&local_210,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2b0,&local_1f0);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1b8,&local_210,&local_2d0);
            basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::basic_error(pbVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1b8);
            __cxa_throw(pbVar8,&basic_error<std::__cxx11::string>::typeinfo,
                        basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~basic_error);
          }
          if (0x20 < (ulong)(local_248._8_8_ - local_248._0_8_)) {
            std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
            poVar1 = (ostream *)(local_1b8 + 0x10);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar1,(char *)(local_2b0->super__NFA_base)._M_paren_stack.
                                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                               ._M_impl.super__Vector_impl_data._M_start,
                                (long)*(pointer *)
                                       ((long)&(local_2b0->super__NFA_base)._M_paren_stack.
                                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                               ._M_impl + 8));
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ambiguous option: --",0x16)
            ;
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,local_2d0._M_dataplus._M_p,local_2d0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," [",2);
            uVar3 = local_248._8_8_;
            if (local_248._M_allocated_capacity != local_248._8_8_) {
              bVar11 = true;
              uVar10 = local_248._M_allocated_capacity;
              do {
                if (!bVar11) {
                  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar1,"--",2);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar1,*(char **)uVar10,*(undefined8 *)(uVar10 + 8));
                uVar10 = uVar10 + 0x20;
                bVar11 = false;
              } while (uVar10 != uVar3);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
            pbVar8 = (basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)__cxa_allocate_exception(0x28);
            std::__cxx11::stringbuf::str();
            basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::basic_error(pbVar8,&local_210);
            __cxa_throw(pbVar8,&basic_error<std::__cxx11::string>::typeinfo,
                        basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~basic_error);
          }
        }
        local_1b8._0_8_ = local_2da;
        local_1b8._8_8_ = &local_2d0;
        local_1a8._M_allocated_capacity = (size_type)local_268;
        local_1a8._8_8_ = local_2da + 2;
        local_198 = &local_2a8;
        local_190 = local_2a0;
        local_188 = peVar4;
        local_180 = local_2da + 1;
        parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>const&,nonsugar::argument_order)
        ::{lambda(auto:1_const&)#3}::operator()((_lambda_auto_1_const___3_ *)local_1b8,local_270);
        parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>const&,nonsugar::argument_order)
        ::{lambda(auto:1_const&)#3}::operator()((_lambda_auto_1_const___3_ *)local_1b8,local_278);
        parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>const&,nonsugar::argument_order)
        ::{lambda(auto:1_const&)#3}::operator()((_lambda_auto_1_const___3_ *)local_1b8,local_280);
        parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>const&,nonsugar::argument_order)
        ::{lambda(auto:1_const&)#3}::operator()((_lambda_auto_1_const___3_ *)local_1b8,local_288);
        parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>const&,nonsugar::argument_order)
        ::{lambda(auto:1_const&)#3}::operator()((_lambda_auto_1_const___3_ *)local_1b8,local_290);
        parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>const&,nonsugar::argument_order)
        ::{lambda(auto:1_const&)#3}::operator()((_lambda_auto_1_const___3_ *)local_1b8,flg_00);
        parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>const&,nonsugar::argument_order)
        ::{lambda(auto:1_const&)#3}::operator()
                  ((_lambda_auto_1_const___3_ *)local_1b8,
                   (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__e_,_boost::optional<int>_>
                    *)flg);
        parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>const&,nonsugar::argument_order)
        ::{lambda(auto:1_const&)#3}::operator()
                  ((_lambda_auto_1_const___3_ *)local_1b8,
                   (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__f_,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)flg_01);
        parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>const&,nonsugar::argument_order)
        ::{lambda(auto:1_const&)#3}::operator()((_lambda_auto_1_const___3_ *)local_1b8,local_298);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_248);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
        }
LAB_00132ebd:
        bVar11 = true;
      }
      else {
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"-(.+)","");
        std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
        basic_regex<std::char_traits<char>,std::allocator<char>>
                  ((basic_regex<char,std::__cxx11::regex_traits<char>> *)local_1b8,&local_2d0,0x10);
        _Var2._M_current = *(char **)uVar3;
        bVar11 = std::__detail::
                 __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                           (_Var2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   )(_Var2._M_current + *(size_type *)(uVar3 + 8)),
                            (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)local_268,
                            (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_1b8,0);
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_1b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
        }
        peVar4 = local_2b0;
        if (bVar11) {
          if (local_268._0_8_ == local_268._8_8_) {
            bVar11 = false;
          }
          else {
            bVar11 = ((long)(local_268._8_8_ - local_268._0_8_) >> 3) * -0x5555555555555555 - 5U <
                     0xfffffffffffffffe;
          }
          psVar6 = (pointer)(local_268._8_8_ + -0x48);
          if (bVar11) {
            psVar6 = (pointer)(local_268._0_8_ + 0x18);
          }
          local_1f0._M_dataplus._M_p =
               (psVar6->
               super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ).first._M_current;
          while( true ) {
            if (local_268._0_8_ == local_268._8_8_) {
              bVar11 = false;
            }
            else {
              bVar11 = ((long)(local_268._8_8_ - local_268._0_8_) >> 3) * -0x5555555555555555 - 5U <
                       0xfffffffffffffffe;
            }
            if (bVar11) {
              psVar6 = (pointer)(local_268._0_8_ + 0x18);
            }
            else {
              psVar6 = (pointer)(local_268._8_8_ + -0x48);
            }
            if (local_1f0._M_dataplus._M_p ==
                (psVar6->
                super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ).second._M_current) break;
            local_248._M_local_buf[0] = *local_1f0._M_dataplus._M_p;
            local_2da[0] = '\0';
            local_1b8._0_8_ = &local_248;
            local_1b8._8_8_ = local_2da;
            local_1a8._M_allocated_capacity = (size_type)peVar4;
            parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>const&,nonsugar::argument_order)
            ::{lambda(auto:1_const&)#4}::operator()
                      ((_lambda_auto_1_const___4_ *)local_1b8,local_270);
            parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>const&,nonsugar::argument_order)
            ::{lambda(auto:1_const&)#4}::operator()
                      ((_lambda_auto_1_const___4_ *)local_1b8,local_278);
            parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>const&,nonsugar::argument_order)
            ::{lambda(auto:1_const&)#4}::operator()
                      ((_lambda_auto_1_const___4_ *)local_1b8,local_280);
            parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>const&,nonsugar::argument_order)
            ::{lambda(auto:1_const&)#4}::operator()
                      ((_lambda_auto_1_const___4_ *)local_1b8,local_288);
            parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>const&,nonsugar::argument_order)
            ::{lambda(auto:1_const&)#4}::operator()
                      ((_lambda_auto_1_const___4_ *)local_1b8,local_290);
            parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>const&,nonsugar::argument_order)
            ::{lambda(auto:1_const&)#4}::operator()((_lambda_auto_1_const___4_ *)local_1b8,flg_00);
            parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>const&,nonsugar::argument_order)
            ::{lambda(auto:1_const&)#4}::operator()
                      ((_lambda_auto_1_const___4_ *)local_1b8,
                       (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__e_,_boost::optional<int>_>
                        *)flg);
            parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>const&,nonsugar::argument_order)
            ::{lambda(auto:1_const&)#4}::operator()
                      ((_lambda_auto_1_const___4_ *)local_1b8,
                       (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__f_,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)flg_01);
            parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>const&,nonsugar::argument_order)
            ::{lambda(auto:1_const&)#4}::operator()
                      ((_lambda_auto_1_const___4_ *)local_1b8,local_298);
            if (local_2da[0] == '\0') {
              pbVar8 = (basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)__cxa_allocate_exception(0x28);
              local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_210,": unrecognized option: -","");
              std::operator+(&local_2d0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_2b0,&local_210);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1b8,&local_2d0,local_248._M_local_buf[0]);
              basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::basic_error(pbVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_1b8);
              __cxa_throw(pbVar8,&basic_error<std::__cxx11::string>::typeinfo,
                          basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::~basic_error);
            }
            local_1b8._0_8_ = &local_248;
            local_1b8._8_8_ = &local_1f0;
            local_1a8._M_allocated_capacity = (size_type)local_268;
            local_1a8._8_8_ = local_2da + 2;
            local_198 = &local_2a8;
            local_190 = local_2a0;
            local_188 = peVar4;
            local_180 = local_2da + 1;
            parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>const&,nonsugar::argument_order)
            ::{lambda(auto:1_const&)#5}::operator()
                      ((_lambda_auto_1_const___5_ *)local_1b8,local_270);
            parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>const&,nonsugar::argument_order)
            ::{lambda(auto:1_const&)#5}::operator()
                      ((_lambda_auto_1_const___5_ *)local_1b8,local_278);
            parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>const&,nonsugar::argument_order)
            ::{lambda(auto:1_const&)#5}::operator()
                      ((_lambda_auto_1_const___5_ *)local_1b8,local_280);
            parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>const&,nonsugar::argument_order)
            ::{lambda(auto:1_const&)#5}::operator()
                      ((_lambda_auto_1_const___5_ *)local_1b8,local_288);
            parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>const&,nonsugar::argument_order)
            ::{lambda(auto:1_const&)#5}::operator()
                      ((_lambda_auto_1_const___5_ *)local_1b8,local_290);
            parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>const&,nonsugar::argument_order)
            ::{lambda(auto:1_const&)#5}::operator()((_lambda_auto_1_const___5_ *)local_1b8,flg_00);
            parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>const&,nonsugar::argument_order)
            ::{lambda(auto:1_const&)#5}::operator()
                      ((_lambda_auto_1_const___5_ *)local_1b8,
                       (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__e_,_boost::optional<int>_>
                        *)flg);
            parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>const&,nonsugar::argument_order)
            ::{lambda(auto:1_const&)#5}::operator()
                      ((_lambda_auto_1_const___5_ *)local_1b8,
                       (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__f_,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)flg_01);
            parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)118,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)86,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)100,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)101,boost::optional<int>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)102,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::detail::flag<std::__cxx11::string,char,(char)103,int>>,std::tuple<>,std::tuple<>>const&,nonsugar::argument_order)
            ::{lambda(auto:1_const&)#5}::operator()
                      ((_lambda_auto_1_const___5_ *)local_1b8,local_298);
            local_1f0._M_dataplus._M_p = local_1f0._M_dataplus._M_p + 1;
          }
          goto LAB_00132ebd;
        }
        if (local_22c == 1) {
          bVar11 = true;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_228,(value_type *)local_2da._2_8_);
        }
        else {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_228
                     ,local_228.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,local_2da._2_8_,local_2a8);
          bVar11 = false;
        }
      }
      if ((pointer)local_268._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_268._0_8_,local_268._16_8_ - local_268._0_8_);
      }
      if ((!bVar11) ||
         (pbVar9 = (pointer)(local_2da._2_8_ + 0x20), local_2da._2_8_ = pbVar9, pbVar9 == local_2a8)
         ) goto LAB_0013323c;
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_228,
               local_228.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,(value_type *)(local_2da._2_8_ + 0x20),
               local_2a8);
  }
LAB_0013323c:
  pbVar9 = local_228.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((local_2da[1] == '\0') &&
     (local_228.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_228.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    pbVar8 = (basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)__cxa_allocate_exception(0x28);
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2d0,": unrecognized argument: ","");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0,
                   &local_2d0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268,
                   pbVar9);
    basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    basic_error(pbVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1b8);
    __cxa_throw(pbVar8,&basic_error<std::__cxx11::string>::typeinfo,
                basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~basic_error);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_228);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1d0);
  return local_2a0;
}

Assistant:

inline typename detail::to_option_map<Command>::type parse(
    Iterator begin, Iterator end, Command const &command, argument_order order)
{
    using string_type = typename Command::string_type;
    using error_type = basic_error<string_type>;
    using regex_type = std::basic_regex<typename string_type::value_type>;
    auto const &_ = detail::widen<string_type>;

    typename detail::to_option_map<Command>::type opts;
    detail::tuple_for_each(command.m_flags, [&](auto const &flg)
        {
            constexpr auto option = detail::remove_cvr_t<decltype(flg)>::option();
            opts.template priv_value<option>() = flg.default_value;
        });

    std::vector<string_type> const args(begin, end);
    auto arg_it = args.begin();
    auto const arg_last = args.end();
    bool exclusive = false;

    constexpr auto subcommand_required =
        std::tuple_size<typename Command::subcommand_tuple_type>::value != 0;
    std::shared_ptr<string_type> subcommand_arg;
    std::vector<string_type> argument_args;

    for (; arg_it != arg_last; ++arg_it) {
        if (*arg_it == _("--")) {
            argument_args.insert(argument_args.end(), std::next(arg_it), arg_last);
            break;
        }
        std::match_results<typename string_type::const_iterator> match;
        if (std::regex_match(*arg_it, match, regex_type(_("--([^=]+)(?:=(.*))?")))) {
            // long flag
            auto const name = match.str(1);
            bool exact = false;
            std::vector<string_type> partial_matches;
            detail::tuple_for_each(command.m_flags, [&](auto const &flg)
                {
                    for (auto const &long_name : flg.long_names) {
                        if (name == long_name) {
                            if (std::exchange(exact, true)) {
                                throw error_type(
                                    command.m_header + _(": ambiguous option: --") + name);
                            }
                        } else if (detail::starts_with(long_name, name)) {
                            partial_matches.push_back(long_name);
                        }
                    }
                });
            if (!exact) {
                if (partial_matches.empty()) {
                    throw error_type(command.m_header + _(": unrecognized option: --") + name);
                } else if (partial_matches.size() >= 2) {
                    detail::sstream<string_type> ss;
                    ss << command.m_header << ": ambiguous option: --" << name << " [";
                    bool first = true;
                    for (auto const &long_name : partial_matches) {
                        if (!std::exchange(first, false)) ss << ", ";
                        ss << "--" << long_name;
                    }
                    ss << "]";
                    throw error_type(ss.str());
                }
            }
            detail::tuple_for_each(command.m_flags, [&](auto const &flg)
                {
                    using flag_type = detail::remove_cvr_t<decltype(flg)>;
                    using value_type = typename flag_type::value_type;
                    constexpr auto option = flag_type::option();
                    for (auto const &long_name : flg.long_names) {
                        if (exact ? name == long_name : detail::starts_with(long_name, name)) {
                            string_type err;
                            detail::parse_flag_long<string_type, value_type>()(
                                match, arg_it, arg_last,
                                opts.template priv_value<option>(), flg, err);
                            if (!err.empty()) {
                                throw error_type(command.m_header + _(": ") + err);
                            }
                            if (flg.exclusive) exclusive = true;
                        }
                    }
                });
        } else if (std::regex_match(*arg_it, match, regex_type(_("-(.+)")))) {
            // short flag
            for (auto it = match[1].first; it != match[1].second; ++it) {
                auto const name = *it;
                bool exact = false;
                detail::tuple_for_each(command.m_flags, [&](auto const &flg)
                    {
                        if (detail::contains(flg.short_names, name)) {
                            if (std::exchange(exact, true)) {
                                throw error_type(
                                    command.m_header + _(": ambiguous option: -") + name);
                            }
                        }
                    });
                if (!exact) {
                    throw error_type(command.m_header + _(": unrecognized option: -") + name);
                }
                detail::tuple_for_each(command.m_flags, [&](auto const &flg)
                    {
                        using flag_type = detail::remove_cvr_t<decltype(flg)>;
                        using value_type = typename flag_type::value_type;
                        constexpr auto option = flag_type::option();
                        if (detail::contains(flg.short_names, name)) {
                            string_type err;
                            detail::parse_flag_short<string_type, value_type>()(
                                it, match[1].second, arg_it, arg_last,
                                opts.template priv_value<option>(), flg, err);
                            if (!err.empty()) {
                                throw error_type(command.m_header + _(": ") + err);
                            }
                            if (flg.exclusive) exclusive = true;
                        }
                    });
            }
        } else if (subcommand_required && !subcommand_arg) {
            // subcommand and arguments
            subcommand_arg = detail::copy_shared(*arg_it);
            argument_args.insert(argument_args.end(), std::next(arg_it), arg_last);
            break;
        } else if (order == argument_order::flexible) {
            // argument
            argument_args.push_back(*arg_it);
        } else {
            // arguments
            argument_args.insert(argument_args.end(), arg_it, arg_last);
            break;
        }
    }

    if (exclusive) return opts;

    auto argument_it = argument_args.begin();
    auto const argument_last = argument_args.end();

    if (subcommand_required) {
        if (!subcommand_arg) {
            throw error_type(command.m_header + _(": command required"));
        }
        bool exact = false;
        detail::tuple_for_each(command.m_subcommands, [&](auto const &subcmd)
            {
                if (subcmd.name == *subcommand_arg) {
                    if (std::exchange(exact, true)) {
                        throw error_type(
                            command.m_header + _(": ambiguous command: ") + *subcommand_arg);
                    }
                }
            });
        if (!exact) {
            throw error_type(command.m_header + _(": unrecognized command: ") + *subcommand_arg);
        }
        detail::tuple_for_each(command.m_subcommands, [&](auto const &subcmd)
            {
                if (subcmd.name == *subcommand_arg) {
                    using subcommand_type = std::remove_cv_t<
                        std::remove_reference_t<decltype(subcmd)>>;
                    constexpr auto option = subcommand_type::option();
                    opts.template priv_value<option>() = detail::copy_shared(
                        parse(argument_it, argument_last, subcmd.command, order));
                }
            });
        return opts;
    }

    detail::tuple_for_each(command.m_arguments, [&](auto const &arg)
        {
            using argument_type = std::remove_cv_t<std::remove_reference_t<decltype(arg)>>;
            using value_type = typename argument_type::value_type;
            constexpr auto option = argument_type::option();
            string_type err;
            detail::parse_argument<string_type, value_type>()(
                argument_it, argument_last, opts.template priv_value<option>(), arg, err);
            if (!err.empty()) {
                throw error_type(command.m_header + _(": ") + err);
            }
        });

    if (argument_it != argument_last) {
        throw error_type(command.m_header + _(": unrecognized argument: ") + *argument_it);
    }

    return opts;
}